

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestDirect.cpp
# Opt level: O3

bool ParseTestDirectLine(string *sString)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  double dVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ostream *poVar8;
  long *plVar9;
  char *pcVar10;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __n;
  char *__n_00;
  char *unaff_R12;
  pointer unaff_R13;
  char *unaff_R14;
  char *unaff_R15;
  undefined1 auVar11 [12];
  string sTestId;
  string sRxPat;
  string sComputedDestLong;
  string sComputedDestLat;
  string sStartLong;
  string sStartLat;
  string sDist;
  string sAzimuth;
  string sDestLat;
  regex pat;
  string sDestLong;
  int sub_matches [7];
  undefined1 *local_380;
  undefined8 local_378;
  undefined1 local_370 [16];
  double local_360;
  char *local_358;
  long local_350;
  char local_348 [16];
  LLPoint local_338;
  pointer local_318;
  pointer local_2f8;
  value_type *local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  char *local_290;
  char *local_288;
  char local_280 [16];
  char *local_270;
  char *local_268;
  char local_260 [16];
  undefined1 *local_250;
  long local_248;
  undefined1 local_240 [16];
  undefined1 *local_230;
  long local_228;
  undefined1 local_220 [16];
  char *local_210;
  undefined8 local_208;
  char local_200 [16];
  string local_1f0;
  string local_1d0;
  char *local_1b0;
  undefined8 local_1a8;
  char local_1a0 [16];
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_190;
  regex_type local_108;
  undefined1 local_e8 [32];
  pointer local_c8;
  pointer psStack_c0;
  pointer local_b8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_b0;
  pointer local_a8;
  pointer piStack_a0;
  pointer piStack_98;
  undefined1 uStack_90;
  undefined7 local_8f;
  undefined1 uStack_88;
  undefined8 uStack_87;
  size_t local_78;
  value_type *pvStack_70;
  bool local_68;
  int local_58 [10];
  
  lVar6 = std::__cxx11::string::find_last_not_of((char *)sString,0x15b244,0xffffffffffffffff);
  uVar7 = lVar6 + 1;
  if (sString->_M_string_length < uVar7) {
    auVar11 = std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                         "basic_string::erase",uVar7);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&local_338);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)local_e8);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_190);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_108);
    if (local_2b0._M_dataplus._M_p != unaff_R13) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
    if (auVar11._8_4_ != 1) {
      if (local_290 != unaff_R12) {
        operator_delete(local_290);
      }
      if (local_270 != unaff_R15) {
        operator_delete(local_270);
      }
      if (local_1b0 != unaff_R14) {
        operator_delete(local_1b0);
      }
      if (local_210 != local_200) {
        operator_delete(local_210);
      }
      if (local_250 != local_240) {
        operator_delete(local_250);
      }
      if (local_230 != local_220) {
        operator_delete(local_230);
      }
      if (local_358 != local_348) {
        operator_delete(local_358);
      }
      _Unwind_Resume(auVar11._0_8_);
    }
    plVar9 = (long *)__cxa_begin_catch(auVar11._0_8_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    pcVar10 = (char *)(**(code **)(*plVar9 + 0x10))(plVar9);
    std::operator<<((ostream *)&std::cout,pcVar10);
    __cxa_end_catch();
    bVar4 = false;
    goto LAB_00133bd9;
  }
  sString->_M_string_length = uVar7;
  (sString->_M_dataplus)._M_p[uVar7] = '\0';
  std::__cxx11::string::find_first_not_of((char *)sString,0x15b244,0);
  std::__cxx11::string::erase((ulong)sString,0);
  local_358 = local_348;
  local_350 = 0;
  local_348[0] = '\0';
  local_230 = local_220;
  local_228 = 0;
  local_220[0] = 0;
  local_250 = local_240;
  local_248 = 0;
  local_240[0] = 0;
  local_210 = local_200;
  local_208 = 0;
  local_200[0] = '\0';
  unaff_R14 = local_1a0;
  local_1a8 = 0;
  local_1a0[0] = '\0';
  unaff_R15 = local_260;
  local_268 = (char *)0x0;
  local_260[0] = '\0';
  unaff_R12 = local_280;
  local_288 = (char *)0x0;
  local_280[0] = '\0';
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  local_290 = unaff_R12;
  local_270 = unaff_R15;
  local_1b0 = unaff_R14;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"([a-zA-Z]*\\d*)[,]","");
  std::__cxx11::string::append((char *)&local_2b0);
  std::__cxx11::string::append((char *)&local_2b0);
  std::__cxx11::string::append((char *)&local_2b0);
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_108,&local_2b0,0x11);
  local_58[4] = 5;
  local_58[5] = 6;
  local_58[6] = 7;
  local_58[0] = 1;
  local_58[1] = 2;
  local_58[2] = 3;
  local_58[3] = 4;
  _Var1._M_current = (sString->_M_dataplus)._M_p;
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
  ::regex_token_iterator<7ul>
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
              *)&local_190,_Var1,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(_Var1._M_current + sString->_M_string_length),&local_108,(int (*) [7])local_58,0);
  uStack_88 = 0;
  uStack_87 = 0;
  piStack_98 = (pointer)0x0;
  uStack_90 = 0;
  local_8f = 0;
  local_a8 = (pointer)0x0;
  piStack_a0 = (pointer)0x0;
  local_b8 = (pointer)0x0;
  _Stack_b0._M_current = (char *)0x0;
  local_c8 = (pointer)0x0;
  psStack_c0 = (pointer)0x0;
  local_e8._16_8_ = (regex_type *)0x0;
  local_e8._24_8_ = 0;
  local_e8._0_8_ = (char *)0x0;
  local_e8._8_8_ = (char *)0x0;
  local_78 = 0;
  pvStack_70 = (value_type *)0x0;
  local_68 = false;
  bVar4 = std::__cxx11::
          regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
          ::operator==(&local_190,
                       (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                        *)local_e8);
  if (!bVar4) {
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&local_338,&local_190,0);
    if (local_2c0->matched == true) {
      local_380 = local_370;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_380,
                 (local_2c0->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 (local_2c0->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_380 = local_370;
      local_378 = 0;
      local_370[0] = 0;
    }
    std::__cxx11::string::operator=((string *)&local_358,(string *)&local_380);
    if (local_380 != local_370) {
      operator_delete(local_380);
    }
    if (local_2f8 != (pointer)0x0) {
      operator_delete(local_2f8);
    }
    if (local_318 != (pointer)0x0) {
      operator_delete(local_318);
    }
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&local_338,&local_190,0);
    local_380 = local_370;
    if (local_2c0->matched == true) {
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_380,
                 (local_2c0->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 (local_2c0->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_378 = 0;
      local_370[0] = 0;
    }
    std::__cxx11::string::operator=((string *)&local_230,(string *)&local_380);
    if (local_380 != local_370) {
      operator_delete(local_380);
    }
    if (local_2f8 != (pointer)0x0) {
      operator_delete(local_2f8);
    }
    if (local_318 != (pointer)0x0) {
      operator_delete(local_318);
    }
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&local_338,&local_190,0);
    if (local_2c0->matched == true) {
      local_380 = local_370;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_380,
                 (local_2c0->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 (local_2c0->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_378 = 0;
      local_370[0] = 0;
      local_380 = local_370;
    }
    std::__cxx11::string::operator=((string *)&local_250,(string *)&local_380);
    if (local_380 != local_370) {
      operator_delete(local_380);
    }
    if (local_2f8 != (pointer)0x0) {
      operator_delete(local_2f8);
    }
    if (local_318 != (pointer)0x0) {
      operator_delete(local_318);
    }
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&local_338,&local_190,0);
    if (local_2c0->matched == true) {
      local_380 = local_370;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_380,
                 (local_2c0->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 (local_2c0->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_378 = 0;
      local_370[0] = 0;
      local_380 = local_370;
    }
    std::__cxx11::string::operator=((string *)&local_210,(string *)&local_380);
    if (local_380 != local_370) {
      operator_delete(local_380);
    }
    if (local_2f8 != (pointer)0x0) {
      operator_delete(local_2f8);
    }
    if (local_318 != (pointer)0x0) {
      operator_delete(local_318);
    }
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&local_338,&local_190,0);
    if (local_2c0->matched == true) {
      local_380 = local_370;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_380,
                 (local_2c0->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 (local_2c0->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_378 = 0;
      local_370[0] = 0;
      local_380 = local_370;
    }
    std::__cxx11::string::operator=((string *)&local_1b0,(string *)&local_380);
    if (local_380 != local_370) {
      operator_delete(local_380);
    }
    if (local_2f8 != (pointer)0x0) {
      operator_delete(local_2f8);
    }
    if (local_318 != (pointer)0x0) {
      operator_delete(local_318);
    }
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&local_338,&local_190,0);
    if (local_2c0->matched == true) {
      local_380 = local_370;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_380,
                 (local_2c0->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 (local_2c0->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_378 = 0;
      local_370[0] = 0;
      local_380 = local_370;
    }
    std::__cxx11::string::operator=((string *)&local_270,(string *)&local_380);
    if (local_380 != local_370) {
      operator_delete(local_380);
    }
    if (local_2f8 != (pointer)0x0) {
      operator_delete(local_2f8);
    }
    if (local_318 != (pointer)0x0) {
      operator_delete(local_318);
    }
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&local_338,&local_190,0);
    if (local_2c0->matched == true) {
      local_380 = local_370;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_380,
                 (local_2c0->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 (local_2c0->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_378 = 0;
      local_370[0] = 0;
      local_380 = local_370;
    }
    std::__cxx11::string::operator=((string *)&local_290,(string *)&local_380);
    if (local_380 != local_370) {
      operator_delete(local_380);
    }
    if (local_2f8 != (pointer)0x0) {
      operator_delete(local_2f8);
    }
    if (local_318 != (pointer)0x0) {
      operator_delete(local_318);
    }
  }
  if (local_a8 != (pointer)0x0) {
    operator_delete(local_a8);
  }
  if (local_c8 != (pointer)0x0) {
    operator_delete(local_c8);
  }
  if (local_190._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_190._M_position._M_match.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190._M_position._M_match.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1d0,local_230,local_230 + local_228);
  local_360 = ParseLatitude(&local_1d0);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1f0,local_250,local_250 + local_248);
  dVar2 = ParseLongitude(&local_1f0);
  local_190._M_position._M_begin._M_current = (char *)(local_360 * 0.017453292519943295);
  local_190._M_position._M_end._M_current = (char *)(dVar2 * 0.017453292519943295);
  local_360 = atof(local_1b0);
  local_360 = local_360 * 0.017453292519943295;
  dVar2 = atof(local_210);
  local_338 = GeoCalcs::DestVincenty((LLPoint *)&local_190,local_360,dVar2 * 1852.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  dVar2 = local_338.longitude * 57.29577951308232;
  local_338.longitude._0_4_ = SUB84(dVar2,0);
  local_338.latitude = local_338.latitude * 57.29577951308232;
  local_338.longitude._4_4_ = (int)((ulong)dVar2 >> 0x20);
  ConvertLatitudeDdToDms_abi_cxx11_((string *)&local_190,(double *)&local_338);
  ConvertLongitudeDdToDms_abi_cxx11_
            ((string *)local_e8,
             (double *)
             ((long)&((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                       *)&local_338)->_M_position + 8));
  _Var1._M_current = local_190._M_position._M_end._M_current;
  pcVar10 = local_268;
  __n._M_current = local_190._M_position._M_end._M_current;
  if (local_268 < local_190._M_position._M_end._M_current) {
    __n._M_current = local_268;
  }
  if (__n._M_current == (char *)0x0) {
    bVar4 = true;
    if (local_190._M_position._M_end._M_current != local_268) goto LAB_00133a40;
  }
  else {
    iVar5 = bcmp(local_190._M_position._M_begin._M_current,local_270,(size_t)__n._M_current);
    if ((_Var1._M_current != pcVar10) || (bVar4 = true, iVar5 != 0)) {
LAB_00133a40:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_358,local_350);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"failed: Expected latitude: ",0x1b);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_270,(long)local_268);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  calced: ",10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,local_190._M_position._M_begin._M_current,
                 (long)local_190._M_position._M_end._M_current);
      bVar4 = false;
    }
  }
  uVar3 = local_e8._8_8_;
  pcVar10 = local_288;
  __n_00 = (char *)local_e8._8_8_;
  if (local_288 < (ulong)local_e8._8_8_) {
    __n_00 = local_288;
  }
  if (__n_00 == (char *)0x0) {
    if ((char *)local_e8._8_8_ != local_288) goto LAB_00133b1a;
  }
  else {
    iVar5 = bcmp((void *)local_e8._0_8_,local_290,(size_t)__n_00);
    if (((char *)uVar3 != pcVar10) || (iVar5 != 0)) {
LAB_00133b1a:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_358,local_350);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"failed: Expected longitude: ",0x1c)
      ;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_290,(long)local_288);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  calced: ",10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,(char *)local_e8._0_8_,local_e8._8_8_);
      bVar4 = false;
    }
  }
  if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
    operator_delete((void *)local_e8._0_8_);
  }
  if ((regex_type **)local_190._M_position._M_begin._M_current != &local_190._M_position._M_pregex)
  {
    operator_delete(local_190._M_position._M_begin._M_current);
  }
LAB_00133bd9:
  if (local_290 != unaff_R12) {
    operator_delete(local_290);
  }
  if (local_270 != unaff_R15) {
    operator_delete(local_270);
  }
  if (local_1b0 != unaff_R14) {
    operator_delete(local_1b0);
  }
  if (local_210 != local_200) {
    operator_delete(local_210);
  }
  if (local_250 != local_240) {
    operator_delete(local_250);
  }
  if (local_230 != local_220) {
    operator_delete(local_230);
  }
  if (local_358 != local_348) {
    operator_delete(local_358);
  }
  return bVar4;
}

Assistant:

bool ParseTestDirectLine(string sString)
{
    bool bPassed = true;
    trim(sString);
    string sTestId, sStartLat, sStartLong, sDist, sAzimuth;
    string sComputedDestLat, sComputedDestLong;

    try
    {
        regex_constants::syntax_option_type flags = regex_constants::icase | regex_constants::ECMAScript;

        string sRxPat = "([a-zA-Z]*\\d*)[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([-+]?[0-9]*[.]?[0-9]+)[,]([-+]?[0-9]*[.]?[0-9]+)[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])";
        regex pat(sRxPat, flags);

        int const sub_matches[] = {1, 2, 3, 4, 5, 6, 7,};
        sregex_token_iterator it(sString.begin(), sString.end(), pat, sub_matches);
        sregex_token_iterator s_end;
        if (it != s_end)
        {
            sTestId = *it++;
            sStartLat = *it++;
            sStartLong = *it++;
            sDist = *it++;
            sAzimuth = *it++;
            sComputedDestLat = *it++;
            sComputedDestLong = *it++;
        }
    }
    catch (regex_error &e)
    {
        cout << "\n" << e.what();
        return false;
    }


    LLPoint ll = DestVincenty(LLPoint(Deg2Rad(ParseLatitude(sStartLat)), Deg2Rad(ParseLongitude(sStartLong))),
                              Deg2Rad(atof(sAzimuth.c_str())), NmToMeters(atof(sDist.c_str())));
    ll.latitude = Rad2Deg(ll.latitude);
    ll.longitude = Rad2Deg(ll.longitude);
    string sDestLat = ConvertLatitudeDdToDms(ll.latitude); // + (ll.latitude < 0.0 ? + "S" : + "N");
    string sDestLong = ConvertLongitudeDdToDms(ll.longitude); // + (ll.longitude < 0.0 ? + "W" : + "E");
    //  double dComputedDestLat = ParseLatitude(sComputedDestLat);
    //  double dComputedDestLong = ParseLongitude(sComputedDestLong);

    if (sDestLat.compare(sComputedDestLat) != 0)
    {
        cout << "\n" << sTestId << "failed: Expected latitude: " << sComputedDestLat << "  calced: " << sDestLat;
        bPassed = false;
    }
    if (sDestLong.compare(sComputedDestLong) != 0)
    {
        cout << "\n" << sTestId << "failed: Expected longitude: " << sComputedDestLong << "  calced: " << sDestLong;
        bPassed = false;
    }
    return bPassed;
}